

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_permissions.cpp
# Opt level: O1

bool NetWhitelistPermissions::TryParse
               (string *str,NetWhitelistPermissions *output,
               ConnectionDirection *output_connection_direction,bilingual_str *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long *plVar4;
  long in_FS_OFFSET;
  size_t offset;
  NetPermissionFlags flags;
  CSubNet subnet;
  string net;
  size_type local_148;
  NetPermissions local_13c;
  char *local_138;
  long *local_130;
  long local_128;
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  bilingual_str local_d0;
  direct_or_indirect local_90;
  uint local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  bool local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Alloc_hider local_38;
  
  local_38._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  bVar3 = anon_unknown.dwarf_2badbf3::TryParsePermissionFlags
                    (str,&local_13c.m_flags,output_connection_direction,&local_148,error);
  if (!bVar3) {
    bVar3 = false;
    goto LAB_006cc1ef;
  }
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_58,str,local_148,0xffffffffffffffff);
  LookupSubNet((CSubNet *)&local_90.indirect_contents,&local_58);
  bVar3 = CSubNet::IsValid((CSubNet *)&local_90.indirect_contents);
  if (bVar3) {
    (output->super_NetPermissions).m_flags = local_13c.m_flags;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&output->m_subnet,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_90.indirect_contents);
    (output->m_subnet).network.m_net = (undefined4)local_78;
    (output->m_subnet).network.m_scope_id = local_78._4_4_;
    (output->m_subnet).valid = local_60;
    *(undefined4 *)(output->m_subnet).netmask = local_70;
    *(undefined4 *)((output->m_subnet).netmask + 4) = uStack_6c;
    *(undefined4 *)((output->m_subnet).netmask + 8) = uStack_68;
    *(undefined4 *)((output->m_subnet).netmask + 0xc) = uStack_64;
    local_130 = local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
    paVar1 = &local_d0.original.field_2;
    local_d0.original._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_130,local_128 + (long)local_130);
    paVar2 = &local_d0.translated.field_2;
    local_d0.translated._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0.translated,local_130,local_128 + (long)local_130);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,&local_d0.original);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,&local_d0.translated);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.translated._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0.translated._M_dataplus._M_p,
                      local_d0.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.original._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0.original._M_dataplus._M_p,
                      local_d0.original.field_2._M_allocated_capacity + 1);
    }
    local_100[0] = local_120[0];
    plVar4 = local_130;
    if (local_130 != local_120) {
LAB_006cc478:
      operator_delete(plVar4,local_100[0] + 1);
    }
  }
  else {
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"Invalid netmask specified in -whitelist: \'%s\'","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Invalid netmask specified in -whitelist: \'%s\'","");
    }
    else {
      local_138 = "Invalid netmask specified in -whitelist: \'%s\'";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_f0,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_138);
    }
    tinyformat::format<std::__cxx11::string>
              (&local_d0,(tinyformat *)local_110,(bilingual_str *)&local_58,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,&local_d0.original);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,&local_d0.translated);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.translated._M_dataplus._M_p != &local_d0.translated.field_2) {
      operator_delete(local_d0.translated._M_dataplus._M_p,
                      local_d0.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.original._M_dataplus._M_p != &local_d0.original.field_2) {
      operator_delete(local_d0.original._M_dataplus._M_p,
                      local_d0.original.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    plVar4 = local_110[0];
    if (local_110[0] != local_100) goto LAB_006cc478;
  }
  if (0x10 < local_80) {
    free(local_90.indirect_contents.indirect);
    local_90.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
LAB_006cc1ef:
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_38._M_p) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool NetWhitelistPermissions::TryParse(const std::string& str, NetWhitelistPermissions& output, ConnectionDirection& output_connection_direction, bilingual_str& error)
{
    NetPermissionFlags flags;
    size_t offset;
    // Only NetWhitebindPermissions should pass a nullptr for output_connection_direction.
    if (!TryParsePermissionFlags(str, flags, &output_connection_direction, offset, error)) return false;

    const std::string net = str.substr(offset);
    const CSubNet subnet{LookupSubNet(net)};
    if (!subnet.IsValid()) {
        error = strprintf(_("Invalid netmask specified in -whitelist: '%s'"), net);
        return false;
    }

    output.m_flags = flags;
    output.m_subnet = subnet;
    error = Untranslated("");
    return true;
}